

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O2

double calculateAngle325(double *list,int size)

{
  double *list_00;
  double *list_01;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int size_00;
  int size_01;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (size == 0) {
    return 0.0;
  }
  list_00 = (double *)malloc(8);
  list_01 = (double *)malloc(8);
  uVar3 = 0;
  uVar1 = 0;
  if (0 < size) {
    uVar1 = (ulong)(uint)size;
  }
  size_00 = 0;
  size_01 = 0;
  iVar4 = 0;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    dVar9 = list[uVar3];
    if (0.0 <= dVar9) {
      lVar2 = (long)size_01;
      size_01 = size_01 + 1;
      list_00[lVar2] = dVar9;
      list_00 = (double *)realloc(list_00,lVar2 * 8 + 0x10);
    }
    else {
      lVar2 = (long)size_00;
      size_00 = size_00 + 1;
      list_01[lVar2] = dVar9;
      list_01 = (double *)realloc(list_01,lVar2 * 8 + 0x10);
    }
    iVar4 = iVar4 + (uint)(90.0 < ABS(list[uVar3]));
  }
  if (size_01 != 0) {
    dVar9 = (double)size;
    dVar7 = (double)size_01;
    if (((dVar7 != dVar9) || (NAN(dVar7) || NAN(dVar9))) && (dVar9 * 0.3 < (double)iVar4)) {
      dVar5 = calculateAvg(list_00,size_01);
      dVar6 = calculateAvg(list_01,size_00);
      dVar8 = ABS(dVar5 - dVar6);
      dVar9 = (double)(~-(ulong)(dVar8 < 180.0) & (ulong)(360.0 - dVar8) |
                      (ulong)dVar8 & -(ulong)(dVar8 < 180.0)) / dVar9;
      if (180.0 < ABS(dVar5) + ABS(dVar6)) {
        dVar6 = dVar6 - dVar7 * dVar9;
        return (double)(~-(ulong)(dVar6 < -180.0) & (ulong)dVar6 |
                       (ulong)(dVar6 + 360.0) & -(ulong)(dVar6 < -180.0));
      }
      return dVar7 * dVar9 + dVar6;
    }
  }
  dVar9 = calculateAvg(list,size);
  return dVar9;
}

Assistant:

double calculateAngle325(double* list,int size){
    int count = 0;
    int positive = 0, negative = 0;
    if(size != 0){
        double *positiveList = (double*)malloc(sizeof(double));
        double *negativeList = (double*)malloc(sizeof(double));
        for (int i = 0; i < size; i++) {
            if(list[i] >= 0){
                positiveList[positive++] = list[i];
                positiveList = realloc(positiveList, sizeof(double) * (positive + 1));
            }else{
                negativeList[negative++] = list[i];
                negativeList = realloc(negativeList, sizeof(double) * (negative + 1));
            }
            if(list[i] > 90 || list[i] < -90)
                count++;
        }
        double sum = size;
        double percent = positive / sum;
        if(positive == 0 || positive == sum)
            return calculateAvg(list,size);
        if(count > sum * 0.3){
            double avgPositive = calculateAvg(positiveList,positive);
            double avgNegative = calculateAvg(negativeList,negative);

            double angleDifferenceABS = fabs(avgPositive - avgNegative);
            double angleDifference = 0;

            if(angleDifferenceABS >= 180){
                angleDifference = 360 - angleDifferenceABS;
            }else{
                angleDifference = angleDifferenceABS;
            }
            double avgPiece = angleDifference / sum;

            if(fabs(avgNegative) + fabs(avgPositive) > 180){
                double num = avgNegative - positive * avgPiece;
                if(num < -180)
                    return num + 360;
                else
                    return num;
            }else{
                double num = avgNegative + positive * avgPiece;
                return num;
            }
        }else{
            return calculateAvg(list,size);
        }
    }else{
        return 0;
    }
}